

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessEngine.cpp
# Opt level: O2

void senjo::ChessEngine::Timer(void *data)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  uint64_t uVar7;
  ulong uVar8;
  char move [8];
  int movenum;
  int seldepth;
  int depth;
  uint64_t nodes;
  uint64_t msecs;
  Output out;
  uint64_t qnodes;
  
  if (data == (void *)0x0) {
    Output::Output((Output *)move,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"ChessEngine::Timer() NULL data parameter");
  }
  else {
    uVar2 = (**(code **)(*data + 0x98))();
    depth = 0;
    movenum = 0;
    seldepth = 0;
    msecs = 0;
    nodes = 0;
    qnodes = 0;
    do {
      if (_quit != '\0') break;
      uVar4 = Now();
      lVar5 = (**(code **)(*data + 0xe8))(data);
      cVar1 = (**(code **)(*data + 0xd8))(data);
      if (cVar1 != '\0') {
        if (lVar5 - 1U < uVar4 + 100) {
          (**(code **)(*data + 0xf8))(data,2);
        }
        else {
          lVar6 = (**(code **)(*data + 0x108))(data);
          if ((lVar6 == 0) && (uVar7 = Output::LastOutput(), uVar7 + uVar2 <= uVar4)) {
            (**(code **)(*data + 0x80))(data,&depth,&seldepth,&nodes,&qnodes,&msecs,&movenum,move,8)
            ;
            Output::Output(&out,NoPrefix);
            std::operator<<((ostream *)&std::cout,"info depth ");
            std::ostream::operator<<((ostream *)&std::cout,depth);
            std::operator<<((ostream *)&std::cout," seldepth ");
            std::ostream::operator<<((ostream *)&std::cout,seldepth);
            std::operator<<((ostream *)&std::cout," nodes ");
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::operator<<((ostream *)&std::cout," time ");
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::operator<<((ostream *)&std::cout," nps ");
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            if (0 < movenum) {
              std::operator<<((ostream *)&std::cout," currmovenumber ");
              std::ostream::operator<<((ostream *)&std::cout,movenum);
              std::operator<<((ostream *)&std::cout," currmove ");
              std::operator<<((ostream *)&std::cout,move);
            }
            Output::~Output(&out);
          }
        }
      }
      uVar8 = (lVar5 - uVar4) - 100;
      if (99 < uVar8) {
        uVar8 = 100;
      }
      iVar3 = usleep((int)uVar8 * 1000);
    } while (iVar3 == 0);
    if (_debug != '\x01') {
      return;
    }
    Output::Output((Output *)move,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"ChessEngine::Timer thread exiting");
  }
  Output::~Output((Output *)move);
  return;
}

Assistant:

void ChessEngine::Timer(void* data)
{
  try {
    if (!data) {
      Output() << "ChessEngine::Timer() NULL data parameter";
      return;
    }

    ChessEngine* engine;
#ifdef NDEBUG
    engine = static_cast<ChessEngine*>(data);
#else
    engine = reinterpret_cast<ChessEngine*>(data);
    if (!engine) {
      Output() << "ChessEngine::Timer() failed to cast data parameter";
      return;
    }
#endif

    const unsigned int outputInterval = engine->TimerOutputInterval();

    char     move[8];
    int      depth = 0;
    int      movenum = 0;
    int      seldepth = 0;
    uint64_t msecs = 0;
    uint64_t nodes = 0;
    uint64_t qnodes = 0;

    while (!_quit) {
      const uint64_t now = Now();
      const uint64_t end = engine->GetStopTime();

      if (engine->IsSearching()) {
        if (end && ((now + 100) >= end)) {
          engine->Stop(StopReason::Timeout);
        }
        else if (!engine->TimeoutOccurred() &&
                 (now >= (Output::LastOutput() + outputInterval)))
        {
          engine->GetStats(&depth, &seldepth, &nodes, &qnodes, &msecs,
                           &movenum, move, sizeof(move));

          Output out(Output::NoPrefix);
          out << "info depth " << depth
              << " seldepth " << seldepth
              << " nodes " << nodes
              << " time " << msecs
              << " nps " << static_cast<uint64_t>(Rate(nodes, msecs));

          if (movenum > 0) {
            out << " currmovenumber " << movenum
                << " currmove " << move;
          }
        }
      }

      const uint64_t tmout = (end - now - 100);
      const uint64_t msecs = std::min<uint64_t>(100, tmout);
      if (!MillisecondSleep(static_cast<unsigned int>(msecs))) {
        break;
      }
    }
  }
  catch (std::exception& e) {
    std::cerr << "info string ChessEngine::Timer() ERROR: "
              << e.what() << std::endl;
  }
  catch (...) {
    std::cerr << "info string ChessEngine::Timer() ERROR: unknown exception"
              << std::endl;
  }

  if (_debug) {
    Output() << "ChessEngine::Timer thread exiting";
  }
}